

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

UdpDeclarationSyntax * __thiscall
slang::parsing::Parser::parseUdpDeclaration(Parser *this,AttrList attr)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token name_00;
  Token primitive_00;
  Token endprimitive;
  NamedBlockClauseSyntax *pNVar1;
  UdpDeclarationSyntax *pUVar2;
  NamedBlockClauseSyntax *in_RDI;
  Token TVar3;
  Token TVar4;
  Token TVar5;
  NamedBlockClauseSyntax *endBlockName;
  Token endprim;
  UdpBodySyntax *body;
  UdpPortListSyntax *portList;
  bool isSequential;
  Token name;
  Token primitive;
  bool *in_stack_00000280;
  Parser *in_stack_00000288;
  undefined1 in_stack_0000033f;
  Parser *in_stack_00000340;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffed8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffee0;
  ParserBase *in_stack_fffffffffffffef0;
  Parser *in_stack_ffffffffffffff00;
  NamedBlockClauseSyntax *pNVar6;
  undefined8 in_stack_ffffffffffffff08;
  Info *in_stack_ffffffffffffff10;
  Parser *in_stack_ffffffffffffff28;
  TokenKind in_stack_ffffffffffffff5e;
  ParserBase *in_stack_ffffffffffffff60;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_68;
  Info *local_60;
  UdpBodySyntax *local_40;
  Info *local_38;
  Info *local_30;
  NamedBlockClauseSyntax *local_28;
  
  TVar3 = ParserBase::consume(in_stack_fffffffffffffef0);
  TVar4 = ParserBase::expect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e);
  parseUdpPortList(in_stack_00000288,in_stack_00000280);
  parseUdpBody(in_stack_00000340,(bool)in_stack_0000033f);
  TVar5 = ParserBase::expect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e);
  pNVar1 = parseNamedBlockClause(in_stack_ffffffffffffff28);
  local_40 = TVar4._0_8_;
  local_38 = TVar4.info;
  TVar4.info = in_stack_ffffffffffffff10;
  TVar4.kind = (short)in_stack_ffffffffffffff08;
  TVar4._2_1_ = (char)((ulong)in_stack_ffffffffffffff08 >> 0x10);
  TVar4.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff08 >> 0x18);
  TVar4.rawLen = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  checkBlockNames(in_stack_ffffffffffffff00,TVar4,in_RDI);
  pNVar6 = in_RDI + 4;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffee0._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffed8;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffed0,elements);
  local_30 = TVar3._0_8_;
  local_28 = (NamedBlockClauseSyntax *)TVar3.info;
  local_68 = TVar5._0_8_;
  local_60 = TVar5.info;
  primitive_00.info = (Info *)pNVar6;
  primitive_00._0_8_ = in_RDI;
  name_00.info = (Info *)in_stack_fffffffffffffef0;
  name_00._0_8_ = pNVar1;
  endprimitive.info = local_30;
  endprimitive._0_8_ = local_38;
  pUVar2 = slang::syntax::SyntaxFactory::udpDeclaration
                     ((SyntaxFactory *)local_60,local_68,primitive_00,name_00,
                      (UdpPortListSyntax *)local_60,local_40,endprimitive,local_28);
  return pUVar2;
}

Assistant:

UdpDeclarationSyntax& Parser::parseUdpDeclaration(AttrList attr) {
    auto primitive = consume();
    auto name = expect(TokenKind::Identifier);

    bool isSequential = false;
    auto& portList = parseUdpPortList(isSequential);
    auto& body = parseUdpBody(isSequential);
    auto endprim = expect(TokenKind::EndPrimitiveKeyword);

    NamedBlockClauseSyntax* endBlockName = parseNamedBlockClause();
    checkBlockNames(name, endBlockName);

    return factory.udpDeclaration(attr, primitive, name, portList, body, endprim, endBlockName);
}